

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O0

void __thiscall ipx::Control::Control(Control *this)

{
  Multistream *in_RDI;
  Timer *in_stack_ffffffffffffffd0;
  
  Parameters::Parameters((Parameters *)in_RDI);
  *(undefined8 *)&(in_RDI->super_ostream).field_0xf0 = 0;
  std::ofstream::ofstream(&(in_RDI->super_ostream).field_0xf8);
  Timer::Timer(in_stack_ffffffffffffffd0);
  Timer::Timer(in_stack_ffffffffffffffd0);
  Multistream::Multistream(in_RDI);
  Multistream::Multistream(in_RDI);
  std::ios::setstate((int)in_RDI + 0x470 +
                     (int)*(undefined8 *)(*(long *)&in_RDI[3].super_ostream.field_0x38 + -0x18));
  return;
}

Assistant:

Control::Control() {
    // When failbit is set, the stream evaluates to false.
    dummy_.setstate(std::ios::failbit);
}